

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_> * __thiscall
pybind11::class_<kratos::Enum,std::shared_ptr<kratos::Enum>>::
def<init_enum_type(pybind11::module_&)::__1>
          (class_<kratos::Enum,std::shared_ptr<kratos::Enum>> *this,char *name_,type *f)

{
  type *f_00;
  handle local_60;
  PyObject *local_58;
  handle local_50;
  handle local_48;
  sibling local_40;
  is_method local_38;
  name local_30;
  cpp_function local_28;
  cpp_function cf;
  type *f_local;
  char *name__local;
  class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_> *this_local;
  
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)f;
  f_00 = method_adaptor<kratos::Enum,init_enum_type(pybind11::module_&)::__1>(f);
  pybind11::name::name(&local_30,name_);
  is_method::is_method(&local_38,(handle *)this);
  local_50.m_ptr = *(PyObject **)this;
  none::none((none *)&local_60);
  local_58 = local_60.m_ptr;
  getattr((pybind11 *)&local_48,local_50,name_,local_60);
  sibling::sibling(&local_40,&local_48);
  cpp_function::
  cpp_function<init_enum_type(pybind11::module_&)::__1,pybind11::name,pybind11::is_method,pybind11::sibling,void>
            (&local_28,f_00,&local_30,&local_38,&local_40);
  object::~object((object *)&local_48);
  none::~none((none *)&local_60);
  pybind11::detail::add_class_method((object *)this,name_,&local_28);
  cpp_function::~cpp_function(&local_28);
  return (class_<kratos::Enum,_std::shared_ptr<kratos::Enum>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }